

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall kratos::Var::copy_meta_data(Var *this,Var *new_var,bool check_param)

{
  Param *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  Var *pVVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  __node_base *p_Var5;
  basic_string_view<char> bVar6;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  string local_a8;
  undefined8 local_88;
  undefined8 uStack_80;
  string local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pVVar4 = this->width_param_;
  if (pVVar4 != (Var *)0x0) {
    iVar2 = (*(new_var->super_IRNode)._vptr_IRNode[0xd])(new_var);
    pVVar4 = copy_var_const_parm(pVVar4,(Generator *)CONCAT44(extraout_var,iVar2),check_param);
    (*(new_var->super_IRNode)._vptr_IRNode[0x23])(new_var,pVVar4);
  }
  p_Var5 = &(this->size_param_)._M_h._M_before_begin;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    pVVar4 = *(Var **)&((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor;
    iVar2 = (*(new_var->super_IRNode)._vptr_IRNode[0xd])(new_var);
    pVVar4 = copy_var_const_parm(pVVar4,(Generator *)CONCAT44(extraout_var_00,iVar2),check_param);
    set_size_param(new_var,(uint32_t)*(size_type *)(p_Var5 + 1),pVVar4);
  }
  if (this->raw_type_param_ == (Param *)0x0) {
    return;
  }
  pPVar1 = this->raw_type_param_->parent_param_;
  if (pPVar1 != (Param *)0x0) {
    iVar2 = (*(pPVar1->super_Const).super_Var.super_IRNode._vptr_IRNode[0xd])(pPVar1);
    iVar3 = (*(new_var->super_IRNode)._vptr_IRNode[0xd])(new_var);
    if (CONCAT44(extraout_var_01,iVar2) == CONCAT44(extraout_var_02,iVar3)) {
      new_var->raw_type_param_ = pPVar1;
      return;
    }
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  (*(this->super_IRNode)._vptr_IRNode[0x1f])(&local_88,this);
  local_48 = local_88;
  uStack_40 = uStack_80;
  bVar6 = fmt::v7::to_string_view<char,_0>
                    (
                    "Unable to copy var definition since the width parametrization is set to different generator for var {0}"
                    );
  format_str.data_ = (char *)bVar6.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_48;
  fmt::v7::detail::vformat_abi_cxx11_(&local_68,(detail *)bVar6.data_,format_str,args);
  local_48 = 0;
  format_str_00.size_ = 0;
  format_str_00.data_ = (char *)local_68._M_string_length;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_48;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_a8,(detail *)local_68._M_dataplus._M_p,format_str_00,args_00);
  UserException::UserException(this_00,&local_a8);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Var::copy_meta_data(Var *new_var, bool check_param) const {
    // basically the parameters
    if (width_param_) {
        auto &new_v = copy_var_const_parm(width_param_, new_var->generator(), check_param);
        new_var->set_width_param(&new_v);
    }
    // need to copy size as well
    // notice that size parameters are actually expressions, so we need to copy all the expressions
    // over using ast visitor
    for (const auto &[index, v] : size_param_) {
        auto &new_v = copy_var_const_parm(v, new_var->generator(), check_param);
        new_var->set_size_param(index, &new_v);
    }

    // need to copy the raw_param as well
    if (raw_type_param_) {
        const auto *parent_param = raw_type_param_->parent_param();
        if (!parent_param || parent_param->generator() != new_var->generator()) {
            throw UserException(::format(
                ::format("Unable to copy var definition since the width parametrization is set to "
                         "different generator for var {0}",
                         to_string())));
        }
        new_var->raw_type_param_ = const_cast<Param *>(parent_param);
    }
}